

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_visit.c
# Opt level: O0

int pop_and_stop(json_object *jso,int flags,json_object *parent_jso,char *jso_key,size_t *jso_index,
                void *userarg)

{
  int iVar1;
  void *userarg_local;
  size_t *jso_index_local;
  char *jso_key_local;
  json_object *parent_jso_local;
  int flags_local;
  json_object *jso_local;
  
  emit_object(jso,flags,parent_jso,jso_key,jso_index,userarg);
  if ((jso_key != (char *)0x0) && (iVar1 = strcmp(jso_key,"subobj1"), iVar1 == 0)) {
    printf("POP after handling subobj1\n");
    return 0x2ff;
  }
  if ((jso_key != (char *)0x0) && (iVar1 = strcmp(jso_key,"obj3"), iVar1 == 0)) {
    printf("STOP after handling obj3\n");
    return 0x1ebb;
  }
  return 0;
}

Assistant:

static int pop_and_stop(json_object *jso, int flags, json_object *parent_jso, const char *jso_key,
                        size_t *jso_index, void *userarg)
{
	(void)emit_object(jso, flags, parent_jso, jso_key, jso_index, userarg);
	if (jso_key != NULL && strcmp(jso_key, "subobj1") == 0)
	{
		printf("POP after handling subobj1\n");
		return JSON_C_VISIT_RETURN_POP;
	}
	if (jso_key != NULL && strcmp(jso_key, "obj3") == 0)
	{
		printf("STOP after handling obj3\n");
		return JSON_C_VISIT_RETURN_STOP;
	}
	return JSON_C_VISIT_RETURN_CONTINUE;
}